

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool bitset_bitset_container_intersection
                (bitset_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint16_t *puVar3;
  long lVar4;
  int size;
  bitset_container_t *dst_00;
  array_container_t *paVar5;
  ushort uVar6;
  int iVar7;
  size_t i;
  long lVar8;
  ulong uVar9;
  uint16_t *puVar10;
  
  size = bitset_container_and_justcard(src_1,src_2);
  if (size < 0x1001) {
    paVar5 = array_container_create_given_capacity(size);
    *dst = paVar5;
    if (paVar5 != (array_container_t *)0x0) {
      paVar5->cardinality = size;
      puVar1 = src_1->words;
      puVar2 = src_2->words;
      puVar3 = paVar5->array;
      uVar6 = 0;
      iVar7 = 0;
      lVar8 = 0;
      do {
        uVar9 = puVar2[lVar8] & puVar1[lVar8];
        if (uVar9 != 0) {
          puVar10 = puVar3 + iVar7;
          do {
            lVar4 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            *puVar10 = (ushort)lVar4 | uVar6;
            puVar10 = puVar10 + 1;
            iVar7 = iVar7 + 1;
            uVar9 = uVar9 & uVar9 - 1;
          } while (uVar9 != 0);
        }
        uVar6 = uVar6 + 0x40;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x400);
    }
  }
  else {
    dst_00 = bitset_container_create();
    *dst = dst_00;
    if (dst_00 != (bitset_container_t *)0x0) {
      bitset_container_and_nocard(src_1,src_2,dst_00);
      *(int *)*dst = size;
    }
  }
  return 0x1000 < size;
}

Assistant:

bool bitset_bitset_container_intersection(
    const bitset_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    const int newCardinality = bitset_container_and_justcard(src_1, src_2);
    if (newCardinality > DEFAULT_MAX_SIZE) {
        *dst = bitset_container_create();
        if (*dst != NULL) {
            bitset_container_and_nocard(src_1, src_2, CAST_bitset(*dst));
            CAST_bitset(*dst)->cardinality = newCardinality;
        }
        return true;  // it is a bitset
    }
    *dst = array_container_create_given_capacity(newCardinality);
    if (*dst != NULL) {
        CAST_array(*dst)->cardinality = newCardinality;
        bitset_extract_intersection_setbits_uint16(
            src_1->words, src_2->words, BITSET_CONTAINER_SIZE_IN_WORDS,
            CAST_array(*dst)->array, 0);
    }
    return false;  // not a bitset
}